

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O0

void __thiscall DSFrame::~DSFrame(DSFrame *this)

{
  DSFrame *this_local;
  
  if ((this->SrcPointers != (uchar **)0x0) && (this->SrcPointers != (uchar **)0x0)) {
    operator_delete__(this->SrcPointers);
  }
  if ((this->DstPointers != (uchar **)0x0) && (this->DstPointers != (uchar **)0x0)) {
    operator_delete__(this->DstPointers);
  }
  if ((this->StrideBytes != (int *)0x0) && (this->StrideBytes != (int *)0x0)) {
    operator_delete__(this->StrideBytes);
  }
  if ((this->_vsdst != (VSFrameRef *)0x0) && (this->_vsdst != this->_vssrc)) {
    (*this->_vsapi->freeFrame)(this->_vsdst);
  }
  if (this->_vssrc != (VSFrameRef *)0x0) {
    (*this->_vsapi->freeFrame)(this->_vssrc);
  }
  PVideoFrame::~PVideoFrame(&this->_avssrc);
  return;
}

Assistant:

~DSFrame()
  {
    if (SrcPointers)
      delete[] SrcPointers;
    if (DstPointers)
      delete[] DstPointers;
    if (StrideBytes)
      delete[] StrideBytes;
    if (_vsdst && _vsdst != _vssrc)
      _vsapi->freeFrame(_vsdst);
    if (_vssrc)
      _vsapi->freeFrame(_vssrc);
  }